

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O1

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadBasicType
          (AsciiParser *this,optional<tinyusdz::value::color4f> *value)

{
  bool bVar1;
  bool bVar2;
  float4 v;
  array<float,_4UL> local_20;
  
  bVar1 = MaybeNone(this);
  if (bVar1) {
    bVar1 = true;
    bVar2 = false;
  }
  else {
    bVar1 = ParseBasicTypeTuple<float,4ul>(this,&local_20);
    if (!bVar1) {
      return bVar1;
    }
    *(float *)&value->contained = local_20._M_elems[0];
    *(float *)((long)&value->contained + 4) = local_20._M_elems[1];
    *(float *)((long)&value->contained + 8) = local_20._M_elems[2];
    *(float *)((long)&value->contained + 0xc) = local_20._M_elems[3];
    bVar2 = true;
    if (value->has_value_ != false) {
      return bVar1;
    }
  }
  value->has_value_ = bVar2;
  return bVar1;
}

Assistant:

bool AsciiParser::ReadBasicType(nonstd::optional<value::color4f> *value) {
  if (MaybeNone()) {
    (*value) = nonstd::nullopt;
    return true;
  }

  value::color4f v;
  if (ReadBasicType(&v)) {
    (*value) = v;
    return true;
  }

  return false;
}